

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

void Lms_GiaNormalize(Lms_Man_t *p)

{
  Vec_Int_t *p_00;
  ulong uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pObj_00;
  Gia_Man_t *pGVar4;
  bool bVar5;
  int local_3c;
  int Next;
  int Prev;
  int Entry;
  int i;
  Vec_Int_t *vTruthIdsNew;
  Vec_Int_t *vRemain;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGiaNew;
  Lms_Man_t *p_local;
  
  local_3c = -1;
  p_01 = Lms_GiaFindNonRedundantCos(p);
  iVar2 = Vec_IntSize(p_01);
  p_02 = Vec_IntAlloc(iVar2);
  Prev = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p_01);
    if (iVar2 <= Prev) {
      Prev = 0;
      while( true ) {
        bVar5 = false;
        if (Prev < p->pGia->nObjs) {
          vRemain = (Vec_Int_t *)Gia_ManObj(p->pGia,Prev);
          bVar5 = vRemain != (Vec_Int_t *)0x0;
        }
        if (!bVar5) break;
        uVar1._0_4_ = vRemain->nCap;
        uVar1._4_4_ = vRemain->nSize;
        if ((uVar1 >> 0x1e & 1) != 0) {
          __assert_fail("pObj->fMark0 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x515,"void Lms_GiaNormalize(Lms_Man_t *)");
        }
        Prev = Prev + 1;
      }
      for (Prev = 0; iVar2 = Gia_ManCoNum(p->pGia), Prev < iVar2; Prev = Prev + 1) {
        Gia_ManPatchCoDriver(p->pGia,Prev,0);
      }
      for (Prev = 0; iVar2 = Vec_IntSize(p_01), Prev < iVar2; Prev = Prev + 1) {
        iVar2 = Vec_IntEntry(p_01,Prev);
        Gia_ManAppendCo(p->pGia,iVar2);
      }
      pGVar4 = p->pGia;
      iVar2 = Gia_ManCoNum(p->pGia);
      iVar3 = Vec_IntSize(p_01);
      pGVar4 = Gia_ManCleanupOutputs(pGVar4,iVar2 - iVar3);
      Gia_ManStop(p->pGia);
      p->pGia = pGVar4;
      Vec_IntFree(p_01);
      Vec_IntFree(p->vTruthIds);
      p->vTruthIds = p_02;
      return;
    }
    iVar2 = Vec_IntEntry(p_01,Prev);
    vRemain = (Vec_Int_t *)Gia_ManCo(p->pGia,iVar2);
    pObj_00 = Gia_ObjFanin0((Gia_Obj_t *)vRemain);
    iVar2 = Gia_ObjIsAnd(pObj_00);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsAnd(Gia_ObjFanin0(pObj))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x50b,"void Lms_GiaNormalize(Lms_Man_t *)");
    }
    iVar2 = Gia_ObjFaninLit0p(p->pGia,(Gia_Obj_t *)vRemain);
    Vec_IntWriteEntry(p_01,Prev,iVar2);
    p_00 = p->vTruthIds;
    iVar2 = Gia_ObjCioId((Gia_Obj_t *)vRemain);
    iVar2 = Vec_IntEntry(p_00,iVar2);
    if (iVar2 < local_3c) break;
    Vec_IntPush(p_02,iVar2);
    Prev = Prev + 1;
    local_3c = iVar2;
  }
  __assert_fail("Prev <= Next",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                ,0x50f,"void Lms_GiaNormalize(Lms_Man_t *)");
}

Assistant:

void Lms_GiaNormalize( Lms_Man_t * p )
{
    Gia_Man_t * pGiaNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vRemain;
    Vec_Int_t * vTruthIdsNew;
    int i, Entry, Prev = -1, Next;
    // collect non-redundant COs
    vRemain = Lms_GiaFindNonRedundantCos( p );
    // change these to be useful literals
    vTruthIdsNew = Vec_IntAlloc( Vec_IntSize(vRemain) );
    Vec_IntForEachEntry( vRemain, Entry, i )
    {
        pObj = Gia_ManCo(p->pGia, Entry);
        assert( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) );
        Vec_IntWriteEntry( vRemain, i, Gia_ObjFaninLit0p(p->pGia, pObj) );
        // create new truth IDs
        Next = Vec_IntEntry(p->vTruthIds, Gia_ObjCioId(pObj));
        assert( Prev <= Next );
        Vec_IntPush( vTruthIdsNew, Next );
        Prev = Next;
    }
    // create a new GIA
    Gia_ManForEachObj( p->pGia, pObj, i )
        assert( pObj->fMark0 == 0 );
    for ( i = 0; i < Gia_ManCoNum(p->pGia); i++ )
        Gia_ManPatchCoDriver( p->pGia, i, 0 );
    Vec_IntForEachEntry( vRemain, Entry, i )
        Gia_ManAppendCo( p->pGia, Entry );
//    pGiaNew = Gia_ManCleanup( p->pGia );
    pGiaNew = Gia_ManCleanupOutputs( p->pGia, Gia_ManCoNum(p->pGia) - Vec_IntSize(vRemain) );
    Gia_ManStop( p->pGia );
    p->pGia = pGiaNew;
    Vec_IntFree( vRemain );
    // update truth IDs
    Vec_IntFree( p->vTruthIds );
    p->vTruthIds = vTruthIdsNew;
//    Vec_IntPrint( vTruthIdsNew );
}